

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lfunc.c
# Opt level: O0

char * luaF_getlocalname(Proto *f,int param_2,int pc,ravi_type_map *type,TString **usertype)

{
  bool bVar1;
  int local_34;
  int i;
  TString **usertype_local;
  ravi_type_map *type_local;
  int pc_local;
  int local_number_local;
  Proto *f_local;
  
  local_34 = 0;
  type_local._4_4_ = param_2;
  while( true ) {
    bVar1 = false;
    if (local_34 < f->sizelocvars) {
      bVar1 = f->locvars[local_34].startpc <= pc;
    }
    if (!bVar1) break;
    if ((pc < f->locvars[local_34].endpc) &&
       (type_local._4_4_ = type_local._4_4_ + -1, type_local._4_4_ == 0)) {
      *type = f->locvars[local_34].ravi_type_map;
      *usertype = f->locvars[local_34].usertype;
      if (f->locvars[local_34].varname == (TString *)0x0) {
        f_local = (Proto *)0x0;
      }
      else {
        f_local = (Proto *)(f->locvars[local_34].varname + 1);
      }
      return (char *)f_local;
    }
    local_34 = local_34 + 1;
  }
  *type = 0xffffffff;
  *usertype = (TString *)0x0;
  return (char *)0x0;
}

Assistant:

const char *luaF_getlocalname (const Proto *f, int local_number, int pc, ravi_type_map *type, TString **usertype) {
  int i;
  for (i = 0; i<f->sizelocvars && f->locvars[i].startpc <= pc; i++) {
    if (pc < f->locvars[i].endpc) {  /* is variable active? */
      local_number--;
      if (local_number == 0) {
        *type = f->locvars[i].ravi_type_map;
        *usertype = f->locvars[i].usertype;
        if (f->locvars[i].varname == NULL)
          return NULL;
        return getstr(f->locvars[i].varname);
      }
    }
  }
  *type = RAVI_TM_ANY;
  *usertype = NULL;
  return NULL;  /* not found */
}